

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O0

void * Thread1_IO(void *arg)

{
  Graph *pGVar1;
  bool bVar2;
  byte bVar3;
  undefined8 *puVar4;
  char *msg;
  undefined4 local_3ec;
  vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
  local_3e8;
  undefined1 local_3d0 [32];
  int breakFlag;
  uint ver2;
  uint ver1;
  char c;
  istringstream EInput;
  char local_221;
  undefined1 local_220 [7];
  char character;
  Edgetype Edges;
  istringstream input;
  string local_88 [8];
  string line;
  uint local_54;
  uint local_50;
  int vEnd;
  int vStart;
  int VEflag;
  int EcmdFlag;
  int VcmdFlag;
  string edgesString;
  uint local_20;
  char local_19;
  uint vertexMaxNum;
  char cmd;
  thread_val *p;
  void *arg_local;
  
  local_19 = '0';
  _vertexMaxNum = (Graph *)arg;
  p = (thread_val *)arg;
  std::__cxx11::string::string((string *)&EcmdFlag);
  VEflag = 0;
  vStart = 0;
  vEnd = 0;
  local_50 = 0;
  local_54 = 0;
  bVar2 = Graph::isEmpty(_vertexMaxNum);
  if (!bVar2) {
    do {
    } while (countVec != 3);
    countVec = 0;
    Graph::printVC(_vertexMaxNum);
  }
  do {
    if (vEnd != 0) {
      local_3ec = 1;
      std::__cxx11::string::~string((string *)&EcmdFlag);
      return (void *)0x0;
    }
    std::__cxx11::string::string(local_88);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_88);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)
               &Edges.
                super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_88,8);
    std::
    vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
              *)local_220);
    bVar3 = std::ios::eof();
    if ((bVar3 & 1) != 0) {
      exit(0);
    }
    while (bVar3 = std::ios::eof(), ((bVar3 ^ 0xff) & 1) != 0) {
      std::operator>>((istream *)
                      &Edges.
                       super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_221);
      bVar3 = std::ios::fail();
      if ((bVar3 & 1) != 0) break;
      local_19 = local_221;
      if (local_221 == 'E') {
        std::operator>>((istream *)
                        &Edges.
                         super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&EcmdFlag);
        std::__cxx11::istringstream::istringstream((istringstream *)&ver1,&EcmdFlag,8);
        local_3d0._24_4_ = 0;
        std::operator>>((istream *)&ver1,(char *)((long)&ver2 + 3));
        while (ver2._3_1_ != '}') {
          std::operator>>((istream *)&ver1,(char *)((long)&ver2 + 3));
          if (ver2._3_1_ == '}') {
            local_3d0._24_4_ = 1;
            break;
          }
          std::istream::operator>>((istream *)&ver1,(uint *)&breakFlag);
          std::operator>>((istream *)&ver1,(char *)((long)&ver2 + 3));
          std::istream::operator>>((istream *)&ver1,(uint *)(local_3d0 + 0x1c));
          std::operator>>((istream *)&ver1,(char *)((long)&ver2 + 3));
          std::operator>>((istream *)&ver1,(char *)((long)&ver2 + 3));
          bVar2 = Graph::isOutOfRange(_vertexMaxNum,breakFlag,local_3d0._28_4_);
          pGVar1 = _vertexMaxNum;
          if (bVar2) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = "Point order out of range.";
            __cxa_throw(puVar4,&char_const*::typeinfo,0);
          }
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::vector(&local_3e8,
                   (vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    *)local_220);
          Graph::connect((Graph *)local_3d0,(int)pGVar1,(sockaddr *)&local_3e8,breakFlag);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::operator=((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                       *)local_220,
                      (vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                       *)local_3d0);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)local_3d0);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector(&local_3e8);
        }
        pGVar1 = _vertexMaxNum;
        if (local_3d0._24_4_ == 1) {
          _vertexMaxNum->EEmpFlag = 1;
        }
        else {
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    *)&msg,(vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                            *)local_220);
          Graph::setEdges(pGVar1,(Edgetype *)&msg);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)&msg);
          vStart = 1;
          _vertexMaxNum->EEmpFlag = 1;
        }
        local_3ec = 8;
        std::__cxx11::istringstream::~istringstream((istringstream *)&ver1);
      }
      else if (local_221 == 'V') {
        std::istream::operator>>
                  ((istream *)
                   &Edges.
                    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_20);
        bVar3 = std::ios::fail();
        if ((bVar3 & 1) != 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = "vertexMaxNum should be an unsigned integar.";
          __cxa_throw(puVar4,&char_const*::typeinfo,0);
        }
        Graph::setVertices(_vertexMaxNum,local_20);
        VEflag = 1;
        _vertexMaxNum->VEmpFlag = 1;
      }
      else if (local_221 == 's') {
        std::istream::operator>>
                  ((istream *)
                   &Edges.
                    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&local_50);
        std::istream::operator>>
                  ((istream *)
                   &Edges.
                    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&local_54);
        bVar2 = Graph::isOutOfRange(_vertexMaxNum,local_50,local_54);
        if (bVar2) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = "Point order out of range.";
          __cxa_throw(puVar4,&char_const*::typeinfo,0);
        }
        Graph::BFS(_vertexMaxNum,local_50);
        Graph::printResult(_vertexMaxNum,local_50,local_54);
      }
    }
    if ((VEflag != 0) && (vStart != 0)) {
      vEnd = 1;
    }
    std::
    vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
               *)local_220);
    std::__cxx11::istringstream::~istringstream
              ((istringstream *)
               &Edges.
                super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_88);
  } while( true );
}

Assistant:

void *Thread1_IO(void *arg)
{
    struct thread_val* p = (struct thread_val*) arg;

    // Variables definition
    char cmd = '0';
    unsigned vertexMaxNum;
    std::string edgesString;
    int VcmdFlag = 0;
    int EcmdFlag = 0;
    int VEflag = 0;
    int vStart = 0;
    int vEnd = 0;

    // output
    if(!p->Database.isEmpty())
    {
        while(true)
        {
            if(countVec == 3)
            {
                countVec = 0;
                break;
            }
        }
        p->Database.printVC();
    }
    // input
    while(VEflag == 0)
    {
        // read a line of input until EOL and store in a string
        std::string line;
        std::getline(std::cin, line);
        std::istringstream input(line);

        Edgetype Edges;
        if(std::cin.eof())
        {
            exit(0);
        }
        // while there are characters in the input line
        while (!input.eof()) 
        {
            // read the first character
            char character;
            input >> character;
            if (input.fail())
            {
                break;
            }
            else
            {
                cmd = character;
            }
            try
            {
                switch(cmd)
                {
                    case 'V':
                        input >> vertexMaxNum;
                        if(input.fail())
                        {
                            throw "vertexMaxNum should be an unsigned integar.";
                            break;
                        }
                        p->Database.setVertices(vertexMaxNum);
                        VcmdFlag = 1;
                        p->Database.VEmpFlag = 1;
                        break;
                    case 'E':
                        {
                            input >> edgesString;

                            std::istringstream EInput(edgesString);
                            char c;
                            unsigned ver1,ver2;
                            int breakFlag = 0;

                            EInput >> c;// read '{'

                            while(c != '}')
                            {
                                EInput >> c;// read '<'
                                if(c!='}')
                                {
                                    EInput >> ver1;// read the first vertex
                                    EInput >> c;// read ','
                                    EInput >> ver2;// read the second vertex
                                    EInput >> c;// read '>'
                                    EInput >> c;// read ',' or '}'

                                    //to determine whether the point order is out of range
                                    if(p->Database.isOutOfRange(ver1,ver2))
                                    {
                                        throw "Point order out of range.";
                                        break;
                                    }

                                    Edges = p->Database.connect(Edges,ver1,ver2);
                                }
                                else
                                {
                                    breakFlag = 1;
                                    break;
                                }
                            }
                            if(breakFlag == 1)
                            {
                                p->Database.EEmpFlag = 1;
                                break;
                            }
                            p->Database.setEdges(Edges);
                            EcmdFlag = 1;
                            p->Database.EEmpFlag = 1;
                            break;
                        }
                        case 's':
                        {
                            input >> vStart ;
                            input >> vEnd;
                            //to determine whether the point order is out of range
                            if(p->Database.isOutOfRange(vStart,vEnd))
                            {
                                throw "Point order out of range.";
                                break;
                            }
                            p->Database.BFS(vStart);
                            p->Database.printResult(vStart,vEnd);
                            break;
                        }    
                    default:
                        break;
                }
            }
            catch(const char* msg)
            {
                std::cerr<< "Error: " << msg << std::endl;
            }
            catch(...)
            {
                std::cerr<< "Error: error happens in other cases."<<std::endl;
            }
        }

        // if read V and E
        if(VcmdFlag && EcmdFlag)
        {
            VEflag = 1;
        }
    }
    return NULL;
}